

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_validator_options.cpp
# Opt level: O1

bool spvParseUniversalLimitsOptions(char *s,spv_validator_limit *type)

{
  bool bVar1;
  int iVar2;
  spv_validator_limit sVar3;
  anon_class_8_1_54a39813 match;
  anon_class_8_1_54a39813 local_20;
  
  local_20.s = s;
  if (s != (char *)0x0) {
    iVar2 = strncmp(s,"--max-struct-members",0x14);
    if (iVar2 == 0) {
      sVar3 = spv_validator_limit_max_struct_members;
      goto LAB_0021387d;
    }
    if (s != (char *)0x0) {
      iVar2 = strncmp(s,"--max-struct_depth",0x12);
      if (iVar2 == 0) {
        sVar3 = spv_validator_limit_max_struct_depth;
        goto LAB_0021387d;
      }
      if (s != (char *)0x0) {
        iVar2 = strncmp(s,"--max-local-variables",0x15);
        if (iVar2 == 0) {
          sVar3 = spv_validator_limit_max_local_variables;
          goto LAB_0021387d;
        }
        if (s != (char *)0x0) {
          iVar2 = strncmp(s,"--max-global-variables",0x16);
          sVar3 = spv_validator_limit_max_global_variables;
          if (iVar2 == 0) goto LAB_0021387d;
          if (s != (char *)0x0) {
            iVar2 = strncmp(s,"--max-switch-branches",0x15);
            if (iVar2 == 0) goto LAB_0021387d;
            if ((s != (char *)0x0) && (iVar2 = strncmp(s,"--max-function-args",0x13), iVar2 == 0)) {
              sVar3 = spv_validator_limit_max_function_args;
              goto LAB_0021387d;
            }
          }
        }
      }
    }
  }
  bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                    (&local_20,"--max-control-flow-nesting-depth");
  sVar3 = spv_validator_limit_max_control_flow_nesting_depth;
  if (!bVar1) {
    bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                      (&local_20,"--max-access-chain-indexes");
    sVar3 = spv_validator_limit_max_access_chain_indexes;
    if (!bVar1) {
      bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                        (&local_20,"--max-id-bound");
      sVar3 = spv_validator_limit_max_id_bound;
      if (!bVar1) {
        return false;
      }
    }
  }
LAB_0021387d:
  *type = sVar3;
  return true;
}

Assistant:

bool spvParseUniversalLimitsOptions(const char* s, spv_validator_limit* type) {
  auto match = [s](const char* b) {
    return s && (0 == strncmp(s, b, strlen(b)));
  };
  if (match("--max-struct-members")) {
    *type = spv_validator_limit_max_struct_members;
  } else if (match("--max-struct_depth")) {
    *type = spv_validator_limit_max_struct_depth;
  } else if (match("--max-local-variables")) {
    *type = spv_validator_limit_max_local_variables;
  } else if (match("--max-global-variables")) {
    *type = spv_validator_limit_max_global_variables;
  } else if (match("--max-switch-branches")) {
    *type = spv_validator_limit_max_global_variables;
  } else if (match("--max-function-args")) {
    *type = spv_validator_limit_max_function_args;
  } else if (match("--max-control-flow-nesting-depth")) {
    *type = spv_validator_limit_max_control_flow_nesting_depth;
  } else if (match("--max-access-chain-indexes")) {
    *type = spv_validator_limit_max_access_chain_indexes;
  } else if (match("--max-id-bound")) {
    *type = spv_validator_limit_max_id_bound;
  } else {
    // The command line option for this validator limit has not been added.
    // Therefore we return false.
    return false;
  }

  return true;
}